

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::addDrawBufferCommonTests
               (TestCaseGroup *root,PrePost prepost)

{
  deUint8 *pdVar1;
  undefined8 uVar2;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar3;
  TestCase *pTVar4;
  BlendState separateEqStateB;
  BlendState enableState;
  BlendState advancedEqStateB;
  BlendState advancedEqStateA;
  BlendState separateEqStateA;
  BlendState disableState;
  BlendState emptyState;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_388;
  undefined1 local_360 [16];
  undefined4 local_350 [2];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_348;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_330;
  undefined1 local_2f8 [24];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_2e0;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_2c8;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_278;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_260;
  undefined1 local_228 [16];
  undefined4 local_218 [2];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_210;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_1f8;
  undefined1 local_1c0 [24];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_1a8;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_190;
  BlendState local_158;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_f0;
  Maybe<tcu::Vector<bool,_4>_> local_d0;
  undefined4 local_c0 [2];
  Maybe<tcu::Vector<bool,_4>_> local_b8;
  Maybe<tcu::Vector<bool,_4>_> local_a8;
  BlendState local_98;
  
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_158.enableBlend.m_ptr = (bool *)0x0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_98,(Maybe<bool> *)local_1c0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_2f8,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)&local_158,(Maybe<tcu::Vector<bool,_4>_> *)local_360);
  local_360._0_8_ = local_360 + 8;
  local_360._8_8_ = local_360._8_8_ & 0xffffffffffffff00;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            (&local_158,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1c0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_228);
  local_228[8] = 1;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)(local_228 + 8);
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1c0,(Maybe<tcu::Vector<bool,_4>_> *)local_290);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_enable_buffer_enable",
                          (BlendState *)local_2f8,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_disable_buffer_disable",&local_158,
                          &local_158);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_disable_buffer_enable",&local_158,
                          (BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_enable_buffer_disable",
                          (BlendState *)local_2f8,&local_158);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  if (local_2c8 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_2c8->m_isFirst = true;
    (local_2c8->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((undefined1 *)local_2f8._16_8_ != (undefined1 *)0x0) {
    *(undefined1 *)local_2f8._16_8_ = 1;
    *(undefined8 *)(local_2f8._16_8_ + 8) = 0;
  }
  if (local_158.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_158.blendFunc.m_ptr)->m_isFirst = true;
    ((local_158.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_158.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_158.blendEq.m_ptr)->m_isFirst = true;
    ((local_158.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360[0] = 1;
  local_350[0] = 0x8006;
  local_1c0._0_8_ = local_1c0 + 8;
  local_1c0[8] = '\x01';
  local_1c0._16_8_ = &local_1a8;
  local_1a8.m_align._0_4_ = 0x8006;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._8_8_ = local_350;
  BlendState::BlendState
            (&local_158,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1c0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_290);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_1c0._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_1c0._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_1c0._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._8_8_ = local_218;
  local_228[0] = 1;
  local_218[0] = 0x800a;
  local_350 = (undefined4  [2])&local_348;
  local_360[8] = 1;
  local_348.m_align._0_4_ = 0x800a;
  local_360._0_8_ = local_360 + 8;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_290,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1c0,(Maybe<tcu::Vector<bool,_4>_> *)&local_388);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_360._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_360._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_360._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._8_8_ = local_280;
  local_290._0_8_ = local_290._0_8_ & 0xffffffffffffff00;
  local_280 = (undefined1  [8])0x800a00008006;
  local_218 = (undefined4  [2])&local_210;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_210._0_8_ = 0x800a00008006;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)(local_228 + 8);
  BlendState::BlendState
            ((BlendState *)local_1c0,(Maybe<bool> *)&local_388,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_228,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_360,(Maybe<tcu::Vector<bool,_4>_> *)&local_f0);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_228._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_228._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_228._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_388.field_1.m_align = (deUint64)(&local_388.field_1.m_align + 1);
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)((ulong)local_388.m_ptr & 0xffffffffffffff00);
  local_388.field_1._8_8_ = 0x80060000800a;
  local_290._0_8_ = local_290 + 8;
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_280 = (undefined1  [8])&local_278;
  local_278._0_8_ = 0x80060000800a;
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_d0.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_360,(Maybe<bool> *)&local_f0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_290,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_228,&local_d0);
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_290._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_290._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(local_290._0_8_ + 8))->m_first = (BlendFunc *)0x0;
  }
  local_d0.m_ptr = (Vector<bool,_4> *)0x0;
  local_f0.field_1.m_align = (deUint64)(&local_f0.field_1.m_align + 1);
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
       CONCAT71(local_f0.m_ptr._1_7_,1);
  local_f0.field_1._8_4_ = 0x929e;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)&local_388.field_1;
  local_388.field_1.m_data[0] = 1;
  local_388.field_1._8_8_ = (long)&local_388.field_1 + 0x10;
  local_388.field_1._16_4_ = 0x929e;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_b8.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_228,(Maybe<bool> *)&local_d0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&local_388,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_290,&local_b8);
  if (local_388.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    ((anon_union_32_2_d0736028_for_Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>_2
      *)&(local_388.m_ptr)->m_isFirst)->m_data[0] = '\x01';
    ((local_388.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  local_b8.m_ptr = (Vector<bool,_4> *)0x0;
  local_d0.field_1.m_align = (deUint64)local_c0;
  local_d0.m_ptr = (Vector<bool,_4> *)CONCAT71(local_d0.m_ptr._1_7_,1);
  local_c0[0] = 0x9295;
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
       &local_f0.field_1;
  local_f0.field_1.m_data[0] = 1;
  local_f0.field_1._8_8_ = (long)&local_f0.field_1 + 0x10;
  local_f0.field_1._16_4_ = 0x9295;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_a8.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_290,(Maybe<bool> *)&local_b8,&local_f0,&local_388,&local_a8);
  pEVar3 = local_f0.m_ptr;
  if (local_f0.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    ((anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
      *)&(local_f0.m_ptr)->m_isFirst)->m_data[0] = '\x01';
    (pEVar3->field_1).m_first = (uint *)0x0;
  }
  pTVar4 = createDiffTest(root->m_context,prepost,"common_blend_eq_buffer_blend_eq",&local_158,
                          (BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_blend_eq_buffer_separate_blend_eq",
                          &local_158,(BlendState *)local_360);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_blend_eq_buffer_advanced_blend_eq",&local_158,
                      (BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_separate_blend_eq_buffer_blend_eq",
                          (BlendState *)local_1c0,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,
                          "common_separate_blend_eq_buffer_separate_blend_eq",
                          (BlendState *)local_1c0,(BlendState *)local_360);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_separate_blend_eq_buffer_advanced_blend_eq",
                      (BlendState *)local_1c0,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_blend_eq",
                      (BlendState *)local_228,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_separate_blend_eq",
                      (BlendState *)local_228,(BlendState *)local_360);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createAdvancedEqDiffTest
                     (root->m_context,prepost,"common_advanced_blend_eq_buffer_advanced_blend_eq",
                      (BlendState *)local_228,(BlendState *)local_290);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  if (local_260 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_260->m_isFirst = true;
    (local_260->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_280 != (undefined1  [8])0x0) {
    *(deUint8 *)local_280 = '\x01';
    pdVar1 = (deUint8 *)((long)local_280 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_1f8 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_1f8->m_isFirst = true;
    (local_1f8->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_218 != (undefined4  [2])0x0) {
    *(deUint8 *)local_218 = '\x01';
    pdVar1 = (deUint8 *)((long)local_218 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_330 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_330->m_isFirst = true;
    (local_330->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_350 != (undefined4  [2])0x0) {
    *(deUint8 *)local_350 = '\x01';
    pdVar1 = (deUint8 *)((long)local_350 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_190 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_190->m_isFirst = true;
    (local_190->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)local_1c0._16_8_ !=
      (anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)0x0) {
    *(deUint8 *)local_1c0._16_8_ = '\x01';
    pdVar1 = (deUint8 *)(local_1c0._16_8_ + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_2c8 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_2c8->m_isFirst = true;
    (local_2c8->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((undefined1 *)local_2f8._16_8_ != (undefined1 *)0x0) {
    *(undefined1 *)local_2f8._16_8_ = 1;
    *(undefined8 *)(local_2f8._16_8_ + 8) = 0;
  }
  if (local_158.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_158.blendFunc.m_ptr)->m_isFirst = true;
    ((local_158.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_158.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_158.blendEq.m_ptr)->m_isFirst = true;
    ((local_158.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360[0] = 1;
  local_350[0] = 0x302;
  local_350[1] = 0x304;
  local_2f8._0_8_ = local_2f8 + 8;
  local_2f8[8] = '\x01';
  local_2f8._16_8_ = &local_2e0;
  local_2e0._0_8_ = 0x30400000302;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._8_8_ = local_350;
  BlendState::BlendState
            (&local_158,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1c0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_290);
  uVar2 = local_2f8._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_2f8._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_2f8._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar2 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228[0] = 1;
  local_218[0] = 0x304;
  local_218[1] = 0x302;
  local_228._8_8_ = local_218;
  local_1c0[8] = '\x01';
  local_1a8._0_8_ = 0x30200000304;
  local_1c0._16_8_ = &local_1a8;
  local_1c0._0_8_ = local_1c0 + 8;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_290,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1c0,(Maybe<tcu::Vector<bool,_4>_> *)&local_388);
  uVar2 = local_1c0._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_1c0._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_1c0._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar2 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._0_8_ = local_290._0_8_ & 0xffffffffffffff00;
  local_280 = (undefined1  [8])0x30400000302;
  local_278._0_8_ = 0x30500000303;
  local_290._8_8_ = local_280;
  local_360._8_8_ = local_360._8_8_ & 0xffffffffffffff00;
  local_348._0_8_ = 0x30400000302;
  local_348._8_8_ = 0x30500000303;
  local_350 = (undefined4  [2])&local_348;
  local_360._0_8_ = local_360 + 8;
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  BlendState::BlendState
            ((BlendState *)local_1c0,(Maybe<bool> *)&local_388,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_228,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_360,(Maybe<tcu::Vector<bool,_4>_> *)&local_f0);
  uVar2 = local_360._0_8_;
  local_228._0_8_ = local_228 + 8;
  local_388.field_1.m_align = (long)&local_388.field_1 + 8;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_360._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_360._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar2 + 8))->m_first = (BlendFunc *)0x0;
  }
  local_f0.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_290._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_388.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)((ulong)local_388.m_ptr & 0xffffffffffffff00);
  local_388.field_1._8_8_ = 0x30200000304;
  local_388.field_1._16_8_ = 0x30300000305;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_210._0_8_ = 0x30200000304;
  local_210._8_8_ = 0x30300000305;
  local_218 = (undefined4  [2])&local_210;
  local_d0.m_ptr = (Vector<bool,_4> *)0x0;
  BlendState::BlendState
            ((BlendState *)local_360,(Maybe<bool> *)&local_f0,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_290,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_228,&local_d0);
  uVar2 = local_228._0_8_;
  if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)local_228._0_8_ !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    *(bool *)local_228._0_8_ = true;
    ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
      *)(uVar2 + 8))->m_first = (BlendFunc *)0x0;
  }
  pTVar4 = createDiffTest(root->m_context,prepost,"common_blend_func_buffer_blend_func",&local_158,
                          (BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_blend_func_buffer_separate_blend_func",
                          &local_158,(BlendState *)local_360);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_separate_blend_func_buffer_blend_func",
                          (BlendState *)local_1c0,(BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  pTVar4 = createDiffTest(root->m_context,prepost,
                          "common_separate_blend_func_buffer_separate_blend_func",
                          (BlendState *)local_1c0,(BlendState *)local_360);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  if (local_330 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_330->m_isFirst = true;
    (local_330->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_350 != (undefined4  [2])0x0) {
    *(deUint8 *)local_350 = '\x01';
    pdVar1 = (deUint8 *)((long)local_350 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_190 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_190->m_isFirst = true;
    (local_190->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)local_1c0._16_8_ !=
      (anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)0x0) {
    *(deUint8 *)local_1c0._16_8_ = '\x01';
    pdVar1 = (deUint8 *)(local_1c0._16_8_ + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_2c8 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_2c8->m_isFirst = true;
    (local_2c8->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)local_2f8._16_8_ !=
      (anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)0x0) {
    *(deUint8 *)local_2f8._16_8_ = '\x01';
    pdVar1 = (deUint8 *)(local_2f8._16_8_ + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_158.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_158.blendFunc.m_ptr)->m_isFirst = true;
    ((local_158.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_158.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_158.blendEq.m_ptr)->m_isFirst = true;
    ((local_158.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_2f8._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_228._8_4_ = 0x10001;
  local_228._0_8_ = local_228 + 8;
  BlendState::BlendState
            (&local_158,(Maybe<bool> *)local_360,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_1c0,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_2f8,(Maybe<tcu::Vector<bool,_4>_> *)local_228);
  local_228._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_360._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_1c0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_290._8_4_ = 0x1000100;
  local_290._0_8_ = local_290 + 8;
  BlendState::BlendState
            ((BlendState *)local_2f8,(Maybe<bool> *)local_228,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)local_360,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1c0,(Maybe<tcu::Vector<bool,_4>_> *)local_290);
  pTVar4 = createDiffTest(root->m_context,prepost,"common_color_mask_buffer_color_mask",&local_158,
                          (BlendState *)local_2f8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar4);
  if (local_2c8 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_2c8->m_isFirst = true;
    (local_2c8->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)local_2f8._16_8_ !=
      (anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
       *)0x0) {
    *(deUint8 *)local_2f8._16_8_ = '\x01';
    pdVar1 = (deUint8 *)(local_2f8._16_8_ + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_158.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_158.blendFunc.m_ptr)->m_isFirst = true;
    ((local_158.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_158.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_158.blendEq.m_ptr)->m_isFirst = true;
    ((local_158.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  if (local_98.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_98.blendFunc.m_ptr)->m_isFirst = true;
    ((local_98.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_98.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_98.blendEq.m_ptr)->m_isFirst = true;
    ((local_98.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  return;
}

Assistant:

void addDrawBufferCommonTests (TestCaseGroup* root, PrePost prepost)
{
	const BlendState		emptyState	= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

	{
		const BlendState	disableState	= BlendState(just(false), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	enableState		= BlendState(just(true), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_enable",	enableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_disable",	disableState,	disableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_enable",	disableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_disable",	enableState,	disableState));
	}

	{
		const BlendState	eqStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_ADD), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	eqStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_SUBTRACT), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	separateEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_ADD, GL_FUNC_SUBTRACT)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	separateEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_SUBTRACT, GL_FUNC_ADD)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	advancedEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_DIFFERENCE), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	advancedEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_SCREEN), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_blend_eq", eqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_separate_blend_eq", eqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_advanced_blend_eq", eqStateA, advancedEqStateB));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_blend_eq", separateEqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_separate_blend_eq", separateEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_advanced_blend_eq", separateEqStateA, advancedEqStateB));

		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_blend_eq", advancedEqStateA, eqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_separate_blend_eq", advancedEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_advanced_blend_eq", advancedEqStateA, advancedEqStateB));
	}

	{
		const BlendState	funcStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA)), Maybe<BVec4>());
		const BlendState	funcStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA)), Maybe<BVec4>());
		const BlendState	separateFuncStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA), BlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_ONE_MINUS_DST_ALPHA))), Maybe<BVec4>());
		const BlendState	separateFuncStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA), BlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA))), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_blend_func",					funcStateA,			funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_separate_blend_func",			funcStateA,			separateFuncStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_blend_func",			separateFuncStateA,	funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_separate_blend_func",	separateFuncStateA,	separateFuncStateB));
	}

	{
		const BlendState	commonColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(true, false, true, false)));
		const BlendState	bufferColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(false, true, false, true)));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_color_mask_buffer_color_mask", commonColorMaskState, bufferColorMaskState));
	}
}